

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValidateDataStructure.cpp
# Opt level: O3

void __thiscall
Assimp::ValidateDSProcess::Validate
          (ValidateDSProcess *this,aiMesh *pMesh,aiBone *pBone,float *afSum)

{
  uint uVar1;
  ulong uVar2;
  float fVar3;
  
  Validate(this,&pBone->mName);
  if (pBone->mNumWeights != 0) {
    uVar2 = 0;
    do {
      uVar1 = pBone->mWeights[uVar2].mVertexId;
      if (pMesh->mNumVertices <= uVar1) {
        ReportError(this,"aiBone::mWeights[%i].mVertexId is out of range",uVar2 & 0xffffffff);
      }
      fVar3 = pBone->mWeights[uVar2].mWeight;
      if (((fVar3 == 0.0) && (!NAN(fVar3))) || (1.0 < fVar3)) {
        ReportWarning(this,"aiBone::mWeights[%i].mWeight has an invalid value",uVar2 & 0xffffffff);
        fVar3 = pBone->mWeights[uVar2].mWeight;
        uVar1 = pBone->mWeights[uVar2].mVertexId;
      }
      afSum[uVar1] = fVar3 + afSum[uVar1];
      uVar2 = uVar2 + 1;
    } while (uVar2 < pBone->mNumWeights);
  }
  return;
}

Assistant:

void ValidateDSProcess::Validate( const aiMesh* pMesh, const aiBone* pBone,float* afSum) {
    this->Validate(&pBone->mName);

    if (!pBone->mNumWeights)    {
        //ReportError("aiBone::mNumWeights is zero");
    }

    // check whether all vertices affected by this bone are valid
    for (unsigned int i = 0; i < pBone->mNumWeights;++i)
    {
        if (pBone->mWeights[i].mVertexId >= pMesh->mNumVertices)    {
            ReportError("aiBone::mWeights[%i].mVertexId is out of range",i);
        }
        else if (!pBone->mWeights[i].mWeight || pBone->mWeights[i].mWeight > 1.0f)  {
            ReportWarning("aiBone::mWeights[%i].mWeight has an invalid value",i);
        }
        afSum[pBone->mWeights[i].mVertexId] += pBone->mWeights[i].mWeight;
    }
}